

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_run(demo *demo)

{
  int iVar1;
  demo *demo_local;
  
  while (iVar1 = glfwWindowShouldClose(demo->window), iVar1 == 0) {
    glfwPollEvents();
    demo_draw(demo);
    if (0.99 < demo->depthStencil) {
      demo->depthIncrement = -0.001;
    }
    if (demo->depthStencil <= 0.8 && demo->depthStencil != 0.8) {
      demo->depthIncrement = 0.001;
    }
    demo->depthStencil = demo->depthIncrement + demo->depthStencil;
    (*glad_vkDeviceWaitIdle)(demo->device);
    demo->curFrame = demo->curFrame + 1;
    if ((demo->frameCount != 0x7fffffff) && (demo->curFrame == demo->frameCount)) {
      glfwSetWindowShouldClose(demo->window,1);
    }
  }
  return;
}

Assistant:

static void demo_run(struct demo *demo) {
    while (!glfwWindowShouldClose(demo->window)) {
        glfwPollEvents();

        demo_draw(demo);

        if (demo->depthStencil > 0.99f)
            demo->depthIncrement = -0.001f;
        if (demo->depthStencil < 0.8f)
            demo->depthIncrement = 0.001f;

        demo->depthStencil += demo->depthIncrement;

        // Wait for work to finish before updating MVP.
        vkDeviceWaitIdle(demo->device);
        demo->curFrame++;
        if (demo->frameCount != INT32_MAX && demo->curFrame == demo->frameCount)
            glfwSetWindowShouldClose(demo->window, GLFW_TRUE);
    }
}